

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::add_torrent_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,add_torrent_alert *this)

{
  element_type *peVar1;
  error_category *peVar2;
  int iVar3;
  undefined4 extraout_var;
  char *in_RCX;
  char *pcVar4;
  span<const_char> in;
  undefined8 local_2c8 [4];
  char info_hash [41];
  char msg [600];
  
  peVar1 = (this->params).ti.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if ((this->params).name._M_string_length == 0) {
      info_hash_t::get_best((sha1_hash *)msg,&(this->params).info_hashes);
      pcVar4 = info_hash;
      in.m_len = (difference_type)pcVar4;
      in.m_ptr = (char *)0x14;
      aux::to_hex((aux *)msg,in,in_RCX);
    }
    else {
      pcVar4 = (this->params).name._M_dataplus._M_p;
    }
  }
  else {
    pcVar4 = (peVar1->m_files).m_name._M_dataplus._M_p;
  }
  if ((this->error).failed_ == true) {
    iVar3 = (**((this->error).cat_)->_vptr_error_category)();
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(local_2c8,peVar2,(ulong)(uint)(this->error).val_);
    snprintf(msg,600,"failed to add torrent \"%s\": [%s] %s",pcVar4,CONCAT44(extraout_var,iVar3),
             local_2c8[0]);
    ::std::__cxx11::string::~string((string *)local_2c8);
  }
  else {
    snprintf(msg,600,"added torrent: %s",pcVar4);
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,msg,(allocator<char> *)local_2c8);
  return __return_storage_ptr__;
}

Assistant:

std::string add_torrent_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[600];
		char info_hash[41];
		char const* torrent_name = info_hash;
		if (params.ti) torrent_name = params.ti->name().c_str();
		else if (!params.name.empty()) torrent_name = params.name.c_str();
#if TORRENT_ABI_VERSION == 1
		else if (!params.url.empty()) torrent_name = params.url.c_str();
#endif
		else aux::to_hex(params.info_hashes.get_best(), info_hash);

		if (error)
		{
			std::snprintf(msg, sizeof(msg), "failed to add torrent \"%s\": [%s] %s"
				, torrent_name, error.category().name()
				, error.message().c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "added torrent: %s", torrent_name);
		}
		return msg;
#endif
	}